

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  int iVar1;
  char *pcVar2;
  ostream *poVar3;
  string *this;
  uint uVar4;
  VEC_INFO vec_info;
  string strAssociation_Path;
  string strKlgFileName;
  allocator<char> local_99;
  undefined1 local_98 [40];
  string local_70;
  string local_50;
  
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  local_70._M_string_length = 0;
  local_70.field_2._M_local_buf[0] = '\0';
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  uVar4 = 0;
switchD_0010446e_caseD_70:
  iVar1 = getopt(argc,argv,"worts");
  switch(iVar1) {
  case 0x6f:
    std::__cxx11::string::string<std::allocator<char>>((string *)local_98,argv[_optind],&local_99);
    this = &local_50;
    goto LAB_001044be;
  case 0x70:
  case 0x71:
  case 0x75:
  case 0x76:
    goto switchD_0010446e_caseD_70;
  case 0x72:
    g_bFlag_reverse = true;
    break;
  case 0x73:
    __isoc99_sscanf(argv[_optind],"%lf",&g_dScale);
    break;
  case 0x74:
    g_bFlag_TUM = true;
    break;
  case 0x77:
    std::__cxx11::string::string<std::allocator<char>>((string *)local_98,argv[_optind],&local_99);
    this = &strWorkingDir_abi_cxx11_;
LAB_001044be:
    std::__cxx11::string::operator=((string *)this,(string *)local_98);
    if ((pointer)local_98._0_8_ != (pointer)(local_98 + 0x10)) {
      operator_delete((void *)local_98._0_8_,(ulong)((long)(long *)local_98._16_8_ + 1));
    }
    break;
  default:
    goto switchD_0010446e_default;
  }
  uVar4 = uVar4 + 1;
  goto switchD_0010446e_caseD_70;
switchD_0010446e_default:
  if (iVar1 == -1) {
    if (uVar4 < 2) {
      main_cold_3();
      iVar1 = -1;
    }
    else {
      iVar1 = chdir(strWorkingDir_abi_cxx11_._M_dataplus._M_p);
      if (iVar1 != 0) {
        main_cold_1();
      }
      pcVar2 = getcwd((char *)0x0,0);
      printf("\nCurrent working directory:\n\t%s\n",pcVar2);
      std::__cxx11::string::_M_assign((string *)&local_70);
      if (strWorkingDir_abi_cxx11_._M_dataplus._M_p[strWorkingDir_abi_cxx11_._M_string_length - 1]
          != '/') {
        std::__cxx11::string::push_back((char)&local_70);
      }
      std::__cxx11::string::append((char *)&local_70);
      local_98._0_8_ = (pointer)0x0;
      local_98._8_8_ = (pointer)0x0;
      local_98._16_8_ = (pointer)0x0;
      iVar1 = parseInfoFile(&local_70,(VEC_INFO *)local_98);
      if (iVar1 == 0) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Depth: ",7);
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,
                            (((pointer)(local_98._8_8_ + -0x48))->second).first._M_dataplus._M_p,
                            (((pointer)(local_98._8_8_ + -0x48))->second).first._M_string_length);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
        std::ostream::put((char)poVar3);
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"RGB: ",5);
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,
                            (((pointer)(local_98._8_8_ + -0x48))->second).second._M_dataplus._M_p,
                            (((pointer)(local_98._8_8_ + -0x48))->second).second._M_string_length);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
        std::ostream::put((char)poVar3);
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"scale: ",7);
        poVar3 = std::ostream::_M_insert<double>(g_dScale);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
        std::ostream::put((char)poVar3);
        std::ostream::flush();
        convertToKlg((VEC_INFO *)local_98,&local_50);
        iVar1 = 0;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Conversion complete!\n",0x15);
      }
      else {
        main_cold_2();
        iVar1 = -1;
      }
      std::
      vector<std::pair<long,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<long,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::~vector((vector<std::pair<long,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<long,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 *)local_98);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,
                      CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                               local_50.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,
                      CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                               local_70.field_2._M_local_buf[0]) + 1);
    }
    return iVar1;
  }
  goto switchD_0010446e_caseD_70;
}

Assistant:

int main(int argc, char* argv[])
{
    int option_count = 0;
    std::string strAssociation_Path;
    std::string strKlgFileName;

    int c = 0;
    while((c = getopt(argc, argv, "worts")) != -1)
    {
        switch(c)
        {
            case 'w'://Dataset directory root path
                option_count++;
                strWorkingDir = std::string(argv[optind]);
                break;
            case 'o'://klg filename
                option_count++;
                strKlgFileName = std::string(argv[optind]);
                break;
            case 'r'://associations.txt is in reverse order (rgb)(depth)
                option_count++;
                g_bFlag_reverse = true;

                break;
            case 't'://TUM format
                option_count++;
                g_bFlag_TUM = true;
                break;
            case 's'://TUM format
                option_count++;
                sscanf(argv[optind], "%lf", &g_dScale);
                break;
            default:
                break;
        }
    }
    if(option_count < 2)
    {
        fprintf(stderr, 
            "Usage: ./pngtoklg -w (working directory) -o (klg file name)\n"    
            "\n"
            "-w working directory\n"
            "-o output klg filename\n"
            "-t TUM format\n"
            "-s Scale factor in floating point ex.  '5000'\n"
            "For more scale factor detail, please reference: \nhttp://vision.in.tum.de/data/datasets/rgbd-dataset/file_formats#intrinsic_camera_calibration_of_the_kinect\n"
            "Example: ./pngtoklg -w ../livingroom_kt0_rs -o liv.klg\n"
            "associations.txt should be in (depth_time)(depth_file)(rgb_time)(rgb_file) order\n");
        return -1;
    }



    /// Change working directory
    int ret = chdir(strWorkingDir.c_str());
    if(ret != 0) 
    {
        fprintf(stderr, RED "dataset path not exist" NONE);
    }
    printf("\nCurrent working directory:\n\t%s\n", getcwd(NULL, 0));


    strAssociation_Path = strWorkingDir;
    if(strWorkingDir[strWorkingDir.length() - 1] != '/')
    {
        strAssociation_Path += '/';
    }
    strAssociation_Path += "associations.txt";
    
    /// Parse files
    // (timestamp, (depth path, rgb path) )
    VEC_INFO vec_info;


    int err = parseInfoFile(
                strAssociation_Path, 
                vec_info);
    if(err != 0)
    {
        fprintf(stderr, 
            RED "Fail to find associations.txt under working directory!\n" NONE); 
        return -1;
    }

    std::cout << "Depth: " << vec_info.back().second.first << std::endl;
    std::cout << "RGB: " << vec_info.back().second.second << std::endl;
    std::cout << "scale: " << g_dScale << std::endl;

    convertToKlg(vec_info, strKlgFileName);

    std::cout << "Conversion complete!\n";
    return 0;
}